

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O2

void __thiscall TPZGenSubStruct::SubStructure(TPZGenSubStruct *this)

{
  TPZGeoMesh *this_00;
  TPZGeoEl *this_01;
  TPZCompMesh *mesh;
  uint uVar1;
  int iVar2;
  int iVar3;
  TPZGeoEl **ppTVar4;
  TPZSubCompMesh *this_02;
  TPZCompEl **ppTVar5;
  long *plVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  TPZCompEl *pTVar10;
  ulong nelem;
  undefined4 uVar11;
  TPZGeoElSide gelside;
  TPZCompElSide local_178;
  TPZCompElSide celside;
  TPZSimpleTimer timeformakeallinternal;
  TPZSimpleTimer timesubstructuring;
  
  TPZSimpleTimer::TPZSimpleTimer(&timesubstructuring);
  this_00 = ((this->fCMesh).fRef)->fPointer->fReference;
  uVar1 = (uint)(this_00->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
    ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (&(this_00->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,uVar7);
    this_01 = *ppTVar4;
    iVar2 = TPZGeoEl::Level(this_01);
    if (iVar2 == this->fSubstructLevel) {
      TPZStack<TPZCompElSide,_10>::TPZStack((TPZStack<TPZCompElSide,_10> *)&timeformakeallinternal);
      iVar2 = (**(code **)(*(long *)this_01 + 0xf0))(this_01);
      gelside.fSide = iVar2 + -1;
      gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
      gelside.fGeoEl = this_01;
      TPZGeoMesh::ResetReference(this_00);
      TPZCompMesh::LoadReferences(((this->fCMesh).fRef)->fPointer);
      TPZGeoElSide::HigherLevelCompElementList2
                (&gelside,(TPZStack<TPZCompElSide,_10> *)&timeformakeallinternal,0,0);
      uVar11 = timeformakeallinternal.fName.field_2._M_allocated_capacity._0_4_;
      if (timeformakeallinternal.fName.field_2._M_allocated_capacity._0_4_ == 0) {
        TPZGeoElSide::Reference(&gelside);
        if (celside.fEl == (TPZCompEl *)0x0) {
          uVar11 = 0;
        }
        else {
          local_178.fEl = celside.fEl;
          local_178.fSide = celside.fSide;
          TPZStack<TPZCompElSide,_10>::Push
                    ((TPZStack<TPZCompElSide,_10> *)&timeformakeallinternal,&local_178);
          uVar11 = 1;
        }
      }
      mesh = ((this->fCMesh).fRef)->fPointer;
      this_02 = (TPZSubCompMesh *)operator_new(0xa78);
      TPZSubCompMesh::TPZSubCompMesh(this_02,mesh);
      std::operator<<((ostream *)&std::cout,'*');
      std::ostream::flush();
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      for (lVar9 = 0; (ulong)(uint)uVar11 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
        TPZCompElSide::Reference
                  ((TPZGeoElSide *)&celside,
                   (TPZCompElSide *)(timeformakeallinternal.fName._M_string_length + lVar9));
        iVar2 = TPZGeoElSide::Dimension((TPZGeoElSide *)&celside);
        if (iVar2 == this->fDimension) {
          (**(code **)(*(long *)&this_02->super_TPZCompMesh + 200))
                    (this_02,mesh,
                     *(undefined8 *)
                      (*(long *)(timeformakeallinternal.fName._M_string_length + lVar9) + 0x10));
        }
      }
      (**(code **)(*(long *)&this_02->super_TPZCompMesh + 0x60))(this_02);
      TPZManVector<TPZCompElSide,_10>::~TPZManVector
                ((TPZManVector<TPZCompElSide,_10> *)&timeformakeallinternal);
    }
  }
  TPZSimpleTimer::ReturnTimeString_abi_cxx11_(&timeformakeallinternal.fName,&timesubstructuring);
  std::operator<<((ostream *)&std::cout,(string *)&timeformakeallinternal);
  std::__cxx11::string::~string((string *)&timeformakeallinternal);
  uVar1 = (uint)(((this->fCMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>
                .fNElements;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
    ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                          super_TPZChunkVector<TPZCompEl_*,_10>,uVar7);
    pTVar10 = *ppTVar5;
    if ((pTVar10 != (TPZCompEl *)0x0) &&
       (iVar2 = (**(code **)(*(long *)pTVar10 + 0xb0))(pTVar10), iVar2 == 0)) goto LAB_012a1d17;
  }
  pTVar10 = (TPZCompEl *)0x0;
LAB_012a1d17:
  if (pTVar10 != (TPZCompEl *)0x0) {
    iVar2 = (**(code **)(*(long *)pTVar10 + 0xa0))(pTVar10);
    for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
      ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,uVar7);
      if ((*ppTVar5 != (TPZCompEl *)0x0) &&
         (plVar6 = (long *)__dynamic_cast(*ppTVar5,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,
                                          0x918), plVar6 != (long *)0x0)) {
        iVar3 = (**(code **)(*plVar6 + 0x180))(plVar6);
        iVar8 = 0;
        if (iVar3 < 1) {
          iVar3 = iVar8;
        }
        while (iVar3 != iVar8) {
          lVar9 = (**(code **)(*plVar6 + 0x178))(plVar6,iVar8);
          iVar8 = iVar8 + 1;
          if (lVar9 == iVar2) {
            (**(code **)(*plVar6 + 200))(plVar6,((this->fCMesh).fRef)->fPointer,pTVar10->fIndex);
            goto LAB_012a1ddf;
          }
        }
      }
    }
  }
LAB_012a1ddf:
  std::operator<<((ostream *)&std::cout,"Making Internal");
  uVar1 = (uint)(((this->fCMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>
                .fNElements;
  std::operator<<((ostream *)&std::cout,"Make all Internal \n");
  TPZSimpleTimer::TPZSimpleTimer(&timeformakeallinternal);
  (**(code **)(*(long *)((this->fCMesh).fRef)->fPointer + 0x78))();
  nelem = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = nelem;
  }
  for (; uVar7 != nelem; nelem = nelem + 1) {
    ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                          super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
    if ((*ppTVar5 != (TPZCompEl *)0x0) &&
       (plVar6 = (long *)__dynamic_cast(*ppTVar5,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,
                                        0x918), plVar6 != (long *)0x0)) {
      std::operator<<((ostream *)&std::cout,'-');
      std::ostream::flush();
      (**(code **)(*plVar6 + 0xa8))(plVar6);
    }
  }
  std::operator<<((ostream *)&std::cout," == Finished\n");
  (**(code **)(*(long *)((this->fCMesh).fRef)->fPointer + 0x88))();
  TPZSimpleTimer::ReturnTimeString_abi_cxx11_((string *)&gelside,&timeformakeallinternal);
  std::operator<<((ostream *)&std::cout,(string *)&gelside);
  std::__cxx11::string::~string((string *)&gelside);
  TPZSimpleTimer::~TPZSimpleTimer(&timeformakeallinternal);
  TPZSimpleTimer::~TPZSimpleTimer(&timesubstructuring);
  return;
}

Assistant:

void TPZGenSubStruct::SubStructure()
{
	TPZSimpleTimer timesubstructuring; // init of timer for substructuring mesh
	
	TPZGeoMesh *gmesh = fCMesh->Reference();
	int nel = gmesh->NElements();
	int iel;
	for(iel=0; iel<nel; iel++)
	{
		TPZGeoEl *gel = gmesh->ElementVec()[iel];
		if(gel->Level() == this->fSubstructLevel)
		{
			TPZStack<TPZCompElSide> subels;
			TPZGeoElSide gelside(gel,gel->NSides()-1);
			gmesh->ResetReference();
			fCMesh->LoadReferences();
			gelside.HigherLevelCompElementList2(subels,0,0);
			int nelstack = subels.NElements();
			if(!nelstack)
			{
				TPZCompElSide celside = gelside.Reference();
				if(celside.Element()) 
				{
					subels.Push(celside);
					nelstack = 1;
				}
			}
			TPZCompMesh *cmesh = fCMesh.operator->();
			TPZSubCompMesh *submesh = new TPZSubCompMesh(*cmesh);
			std::cout << '*';
			std::cout.flush();
			int sub;
			for(sub=0; sub<nelstack; sub++)
			{
				if(subels[sub].Reference().Dimension() == fDimension)
				{
					submesh->TransferElement(cmesh,subels[sub].Element()->Index());
#ifdef PZDEBUG 
					submesh->VerifyDatastructureConsistency();
#endif
				}
			}
			submesh->ExpandSolution();
		}
	}
	
	std::cout << timesubstructuring.ReturnTimeString(); // end of timer for substructuring mesh
	
	// transfer the point load
	// find the point elements
	nel = fCMesh->NElements();
	TPZCompEl *celpoint = 0;
	for(iel=0; iel<nel; iel++)
	{
		TPZCompEl *cel = fCMesh->ElementVec()[iel];
		if(!cel) continue;
		if(cel->Dimension() == 0) 
		{
			celpoint = cel;
			break;
		}
	}
	if(celpoint)
	{
		int conindex = celpoint->ConnectIndex(0);
		for(iel=0; iel<nel; iel++)
		{
			TPZCompEl *cel = fCMesh->ElementVec()[iel];
			if(!cel) continue;
			TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *>(cel);
			if(!submesh) continue;
			int nc = submesh->NConnects();
			int ic;
			for(ic=0; ic<nc; ic++)
			{
				if(submesh->ConnectIndex(ic) == conindex)
				{
					submesh->TransferElement(fCMesh.operator->(),celpoint->Index());
					celpoint = 0;
					conindex = -1;
					break;
				}
			}
			if(!celpoint) break;
		}
	}
	
	//#define MAKEINTERNAL
#ifdef MAKEINTERNAL
	std::cout << "Making Internal";
	// make all nodes internal
	nel = fCMesh->NElements();
	
	std::cout << "Make all Internal \n";
	TPZSimpleTimer timeformakeallinternal; // init for timer
	fCMesh->ComputeNodElCon();
	for(iel=0; iel<nel; iel++)
	{
		TPZCompEl *cel = fCMesh->ElementVec()[iel];
		if(!cel) continue;
		TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *>(cel);
		if(!submesh) continue;
		std::cout << '-'; std::cout.flush();
		submesh->MakeAllInternal();
	}
	std::cout << " == Finished\n";
	fCMesh->CleanUpUnconnectedNodes();
	
	std::cout << timeformakeallinternal.ReturnTimeString();
#endif
}